

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithitools.cpp
# Opt level: O3

int check_execution_mode(ithi_tool_mode proposed,ithi_tool_mode *current)

{
  if (*current == ithi_mode_unspecified) {
    *current = proposed;
    return 0;
  }
  check_execution_mode();
  return -1;
}

Assistant:

static int check_execution_mode(ithi_tool_mode proposed, ithi_tool_mode * current)
{
    int exit_code = 0;
    if (*current != ithi_mode_unspecified && proposed != 0)
    {
        fprintf(stderr, "Can only specify one execution mode!\n");
        exit_code = usage();
    }
    else
    {
        *current = proposed;
    }

    return exit_code;
}